

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

char * __thiscall bodyArg::extract(bodyArg *this,char *buf,int32_t *ofs,int32_t *len)

{
  int iVar1;
  size_t sVar2;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  int32_t *in_RDI;
  int32_t *unaff_retaddr;
  uchar *in_stack_00000008;
  char *ret;
  char *local_28;
  
  if (*(long *)(in_RDI + 2) == 0) {
    local_28 = in_RSI;
    if (*(long *)(in_RDI + 6) == 0) {
      if (*(long *)(in_RDI + 8) == 0) {
        if (*(long *)(in_RDI + 10) == 0) {
          *in_RCX = 0;
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0xc) + 0x40))(*(long **)(in_RDI + 0xc),(long)*in_RDX,0);
          iVar1 = (**(code **)(**(long **)(in_RDI + 0xc) + 0x18))
                            (*(long **)(in_RDI + 0xc),in_RSI,(long)*in_RCX);
          *in_RCX = iVar1;
          *in_RDX = *in_RCX + *in_RDX;
        }
      }
      else {
        sVar2 = CVmObjByteArray::copy_to_buf
                          ((CVmObjByteArray *)ret,in_stack_00000008,(unsigned_long)unaff_retaddr,
                           (size_t)in_RDI);
        *in_RCX = (int)sVar2;
        *in_RDX = *in_RCX + *in_RDX;
      }
    }
    else {
      CVmObjStringBuffer::to_utf8
                ((CVmObjStringBuffer *)ret,(char *)in_stack_00000008,unaff_retaddr,in_RDI);
    }
  }
  else {
    if (in_RDI[0x13] < *in_RCX) {
      *in_RCX = in_RDI[0x13];
    }
    local_28 = (char *)(*(long *)(in_RDI + 2) + (long)*in_RDX);
    *in_RDX = *in_RCX + *in_RDX;
  }
  return local_28;
}

Assistant:

const char *extract(char *buf, int32_t &ofs, int32_t &len)
    {
        /* assume we'll have to copy into the caller's buffer */
        const char *ret = buf;

        /* determine what to do based on the source type */
        if (str != 0)
        {
            /* limit the length to the actual source length */
            if (len > this->len)
                len = this->len;

            /* get a pointer to the requested substring */
            ret = str + ofs;

            /* move the offset past the requested portion */
            ofs += len;
        }
        else if (strbuf != 0)
        {
            /* 
             *   for a string buffer, we have to translate to utf8 - this
             *   updates 'idx' and 'len' per our interface
             */
            strbuf->to_utf8(buf, ofs, len);
        }
        else if (bytarr != 0)
        {
            /* 
             *   It's a byte array - copy bytes to the caller's buffer.  Note
             *   that we use 0-based offsets, and the byte array uses 1-based
             *   offsets, so adjust accordingly. 
             */
            len = bytarr->copy_to_buf((unsigned char *)buf, ofs + 1, len);

            /* adjust the offset for the actual copied size */
            ofs += len;
        }
        else if (file != 0)
        {
            /* 
             *   It's a File object - read bytes from the file into the
             *   caller's buffer. 
             */
            datasource->seek(ofs, OSFSK_SET);
            len = datasource->readc(buf, len);

            /* adjust the offset for the actual copied size */
            ofs += len;
        }
        else
        {
            /* didn't read anything */
            len = 0;
        }

        /* return the result pointer */
        return ret;
    }